

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O3

void __thiscall ANN::~ANN(ANN *this)

{
  pointer piVar1;
  pointer ppLVar2;
  
  piVar1 = (this->layerSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->layerSizes).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ppLVar2 = (this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppLVar2 != (pointer)0x0) {
    operator_delete(ppLVar2,(long)(this->layers).
                                  super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppLVar2);
    return;
  }
  return;
}

Assistant:

ANN::~ANN()
{
    
}